

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose_main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  Env env;
  char *local_7d8;
  long local_7d0;
  char local_7c8 [16];
  result_t local_7b8;
  ExttposeArgument local_750;
  undefined1 local_608 [376];
  ostringstream local_490 [112];
  ios_base local_420 [264];
  ostringstream local_318 [112];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  Env::Env((Env *)local_608);
  local_750.input._M_dataplus._M_p = (pointer)&local_750.input.field_2;
  local_750.input._M_string_length = 0;
  local_750.input.field_2._M_local_buf[0] = '\0';
  local_750.output._M_dataplus._M_p = (pointer)&local_750.output.field_2;
  local_750.output._M_string_length = 0;
  local_750.output.field_2._M_local_buf[0] = '\0';
  local_750.idxfn._M_dataplus._M_p = (pointer)&local_750.idxfn.field_2;
  local_750.idxfn._M_string_length = 0;
  local_750.idxfn.field_2._M_local_buf[0] = '\0';
  local_750.inconfn._M_dataplus._M_p = (pointer)&local_750.inconfn.field_2;
  local_750.inconfn._M_string_length = 0;
  local_750.inconfn.field_2._M_local_buf[0] = '\0';
  local_750.it2fn._M_dataplus._M_p = (pointer)&local_750.it2fn.field_2;
  local_750.it2fn._M_string_length = 0;
  local_750.it2fn.field_2._M_local_buf[0] = '\0';
  local_750.seqfn._M_dataplus._M_p = (pointer)&local_750.seqfn.field_2;
  local_750.seqfn._M_string_length = 0;
  local_750.seqfn.field_2._M_local_buf[0] = '\0';
  local_750.tmpfn._M_dataplus._M_p = (pointer)&local_750.tmpfn.field_2;
  local_750.tmpfn._M_string_length = 0;
  local_750.tmpfn.field_2._M_local_buf[0] = '\0';
  local_750.MINSUP_PER = 0.0;
  local_750.do_invert = 1;
  local_750.do_l2 = 1;
  local_750.use_seq = 1;
  local_750.write_only_fcnt = 1;
  local_750.use_newformat = '\x01';
  local_750.num_partitions = 1;
  local_750.no_minus_off = '\0';
  local_750.use_diff = '\0';
  local_750.DBASE_AVG_CUST_SZ = 0.0;
  local_750.AMEM = 0x25a0000;
  local_750.name._M_dataplus._M_p = (pointer)&local_750.name.field_2;
  local_750.name._M_string_length = 0;
  local_750.name.field_2._M_local_buf[0] = '\0';
  ExttposeArgument::parse_args(&local_750,argc,argv);
  exttposeFunc(&local_7b8,(Env *)local_608,&local_750);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.summary._M_dataplus._M_p != &local_7b8.summary.field_2) {
    operator_delete(local_7b8.summary._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.logger._M_dataplus._M_p != &local_7b8.logger.field_2) {
    operator_delete(local_7b8.logger._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.seqstrm._M_dataplus._M_p != &local_7b8.seqstrm.field_2) {
    operator_delete(local_7b8.seqstrm._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7d8,local_7d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8);
  }
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7d8,local_7d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8);
  }
  ExttposeArgument::~ExttposeArgument(&local_750);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::ios_base::~ios_base(local_2a8);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
  std::ios_base::~ios_base((ios_base *)(local_608 + 0x70));
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    try {
        Env env;
        ExttposeArgument args;
        args.parse_args(argc, argv);
        exttposeFunc(env, args);
        cout << env.logger.str() << endl;
        cout << env.summary.str() << endl;
        return 0;
    }
    catch (exception &e) {
        cerr << "exttpose: Caught exception: " << e.what() << endl;
    }
    catch (...) {
        cerr << "exttpose: Caught unknown exception" << endl;
    }
    return 1;
}